

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.h
# Opt level: O2

bool __thiscall flow::Signature::operator!=(Signature *this,Signature *v)

{
  bool bVar1;
  string sStack_58;
  string local_38;
  
  to_s_abi_cxx11_(&sStack_58,this);
  to_s_abi_cxx11_(&local_38,v);
  bVar1 = std::operator!=(&sStack_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return bVar1;
}

Assistant:

bool operator!=(const Signature& v) const { return to_s() != v.to_s(); }